

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

bool boundScaleOk(vector<double,_std::allocator<double>_> *lower,
                 vector<double,_std::allocator<double>_> *upper,HighsInt bound_scale,
                 double infinite_bound)

{
  double dVar1;
  pointer pdVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  
  if (bound_scale == 0) {
    return true;
  }
  dVar6 = ldexp(1.0,bound_scale);
  pdVar2 = (lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)(lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
  bVar3 = (int)uVar4 < 1;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      dVar1 = pdVar2[uVar5];
      if (((dVar1 != -INFINITY) && (infinite_bound < ABS(dVar1 * dVar6))) ||
         ((dVar1 = (upper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar5], dVar1 != INFINITY &&
          (infinite_bound < ABS(dVar1 * dVar6))))) {
        return false;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
    bVar3 = (uVar4 & 0x7fffffff) <= uVar5;
  }
  return bVar3;
}

Assistant:

bool boundScaleOk(const vector<double>& lower, const vector<double>& upper,
                  const HighsInt bound_scale, const double infinite_bound) {
  if (!bound_scale) return true;
  double bound_scale_value = std::pow(2, bound_scale);
  for (HighsInt iCol = 0; iCol < HighsInt(lower.size()); iCol++) {
    if (lower[iCol] > -kHighsInf &&
        std::abs(lower[iCol] * bound_scale_value) > infinite_bound)
      return false;
    if (upper[iCol] < kHighsInf &&
        std::abs(upper[iCol] * bound_scale_value) > infinite_bound)
      return false;
  }
  return true;
}